

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O2

aom_codec_err_t av1_ext_part_delete(ExtPartController *ext_part_controller)

{
  aom_ext_part_status_t aVar1;
  
  if (ext_part_controller == (ExtPartController *)0x0) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if ((ext_part_controller->ready != 0) &&
     (aVar1 = (*(ext_part_controller->funcs).delete_model)(ext_part_controller->model),
     aVar1 != AOM_EXT_PART_OK)) {
    return AOM_CODEC_ERROR;
  }
  return AOM_CODEC_OK;
}

Assistant:

aom_codec_err_t av1_ext_part_delete(ExtPartController *ext_part_controller) {
  if (ext_part_controller == NULL) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (ext_part_controller->ready) {
    const aom_ext_part_status_t status =
        ext_part_controller->funcs.delete_model(ext_part_controller->model);
    if (status != AOM_EXT_PART_OK) {
      return AOM_CODEC_ERROR;
    }
  }
  return ext_part_init(ext_part_controller);
}